

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall
sglr::rc::Texture2DArray::sample4
          (Texture2DArray *this,Vec4 *output,Vec3 *packetTexcoords,float lodBias)

{
  undefined8 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int i;
  long lVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  ulong uVar10;
  bool bVar11;
  uint uVar12;
  uint uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  float fVar18;
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  Vec3 dFdy1;
  Vec3 dFdy0;
  Vec3 dFdx1;
  Vec3 dFdx0;
  float local_98 [4];
  float local_88 [4];
  float local_78 [4];
  float local_68 [4];
  undefined1 local_58 [24];
  Texture2DArrayView local_40;
  
  if ((this->m_view).m_numLevels < 1) {
    local_58._0_16_ = ZEXT416(0);
  }
  else {
    uVar1 = *(undefined8 *)(((this->m_view).m_levels)->m_size).m_data;
    local_58._0_4_ = (undefined4)(int)uVar1;
    local_58._4_4_ = (undefined4)(int)((ulong)uVar1 >> 0x20);
    local_58._8_8_ = 0;
  }
  local_68[2] = 0.0;
  local_68[0] = 0.0;
  local_68[1] = 0.0;
  lVar6 = 0;
  do {
    local_68[lVar6] = packetTexcoords[1].m_data[lVar6] - packetTexcoords->m_data[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  local_78[2] = 0.0;
  local_78[0] = 0.0;
  local_78[1] = 0.0;
  lVar6 = 0;
  do {
    local_78[lVar6] = packetTexcoords[3].m_data[lVar6] - packetTexcoords[2].m_data[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  local_88[2] = 0.0;
  local_88[0] = 0.0;
  local_88[1] = 0.0;
  lVar6 = 0;
  do {
    local_88[lVar6] = packetTexcoords[2].m_data[lVar6] - packetTexcoords->m_data[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  local_98[2] = 0.0;
  local_98[0] = 0.0;
  local_98[1] = 0.0;
  lVar6 = 0;
  do {
    local_98[lVar6] = packetTexcoords[3].m_data[lVar6] - packetTexcoords[1].m_data[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  fVar5 = local_68[0];
  fVar4 = local_78[0];
  fVar3 = local_88[0];
  fVar2 = local_98[0];
  pfVar9 = packetTexcoords->m_data + 2;
  uVar10 = 0;
  do {
    fVar16 = fVar5;
    if (1 < uVar10) {
      fVar16 = fVar4;
    }
    pfVar7 = local_78;
    if (1 >= uVar10) {
      pfVar7 = local_68;
    }
    bVar11 = (uVar10 & 1) != 0;
    fVar18 = fVar3;
    if (bVar11) {
      fVar18 = fVar2;
    }
    pfVar8 = local_98;
    if (!bVar11) {
      pfVar8 = local_88;
    }
    auVar15._4_4_ = pfVar7[1];
    auVar15._0_4_ = fVar16;
    auVar15._8_8_ = 0;
    auVar19._0_8_ = CONCAT44(pfVar7[1],fVar16) ^ 0x8000000080000000;
    auVar19._8_4_ = 0x80000000;
    auVar19._12_4_ = 0x80000000;
    auVar19 = maxps(auVar19,auVar15);
    auVar17._4_4_ = pfVar8[1];
    auVar17._0_4_ = fVar18;
    auVar17._8_8_ = 0;
    auVar14._0_8_ = CONCAT44(pfVar8[1],fVar18) ^ 0x8000000080000000;
    auVar14._8_4_ = 0x80000000;
    auVar14._12_4_ = 0x80000000;
    auVar15 = maxps(auVar14,auVar17);
    uVar12 = -(uint)(auVar15._0_4_ <= auVar19._0_4_);
    uVar13 = -(uint)(auVar15._4_4_ <= auVar19._4_4_);
    fVar16 = (float)(~uVar12 & (uint)auVar15._0_4_ | (uint)auVar19._0_4_ & uVar12) *
             (float)local_58._0_4_;
    fVar18 = (float)(~uVar13 & (uint)auVar15._4_4_ | (uint)auVar19._4_4_ & uVar13) *
             (float)local_58._4_4_;
    uVar12 = -(uint)(fVar18 <= fVar16);
    fVar16 = logf((float)(~uVar12 & (uint)fVar18 | (uint)fVar16 & uVar12));
    tcu::Texture2DArrayView::sample
              (&local_40,(Sampler *)&this->m_view,((Vec3 *)(pfVar9 + -2))->m_data[0],pfVar9[-1],
               *pfVar9,fVar16 * 1.442695 + lodBias);
    output->m_data[0] = (float)local_40.m_numLevels;
    output->m_data[1] = (float)local_40._4_4_;
    *(ConstPixelBufferAccess **)(output->m_data + 2) = local_40.m_levels;
    uVar10 = uVar10 + 1;
    output = output + 1;
    pfVar9 = pfVar9 + 3;
  } while (uVar10 != 4);
  return;
}

Assistant:

void Texture2DArray::sample4 (tcu::Vec4 output[4], const tcu::Vec3 packetTexcoords[4], float lodBias) const
{
	const float texWidth  = (float)m_view.getWidth();
	const float texHeight = (float)m_view.getHeight();

	const tcu::Vec3 dFdx0 = packetTexcoords[1] - packetTexcoords[0];
	const tcu::Vec3 dFdx1 = packetTexcoords[3] - packetTexcoords[2];
	const tcu::Vec3 dFdy0 = packetTexcoords[2] - packetTexcoords[0];
	const tcu::Vec3 dFdy1 = packetTexcoords[3] - packetTexcoords[1];

	for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
	{
		const tcu::Vec3& dFdx = (fragNdx & 2) ? dFdx1 : dFdx0;
		const tcu::Vec3& dFdy = (fragNdx & 1) ? dFdy1 : dFdy0;

		const float mu = de::max(de::abs(dFdx.x()), de::abs(dFdy.x()));
		const float mv = de::max(de::abs(dFdx.y()), de::abs(dFdy.y()));
		const float p = de::max(mu * texWidth, mv * texHeight);

		const float	lod = deFloatLog2(p) + lodBias;

		output[fragNdx] = sample(packetTexcoords[fragNdx].x(), packetTexcoords[fragNdx].y(), packetTexcoords[fragNdx].z(), lod);
	}
}